

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imageadapter.h
# Opt level: O1

void __thiscall
bgui::ImageAdapter<unsigned_char>::setSmoothing(ImageAdapter<unsigned_char> *this,bool tf)

{
  pointer pIVar1;
  pointer pIVar2;
  undefined7 in_register_00000031;
  Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *image;
  pointer this_00;
  Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> IStack_58;
  
  if ((int)CONCAT71(in_register_00000031,tf) != 0) {
    if ((this->mipmap).
        super__Vector_base<gimage::Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>,_std::allocator<gimage::Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish ==
        (this->mipmap).
        super__Vector_base<gimage::Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>,_std::allocator<gimage::Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      image = this->image;
      if (image->width < 0x41) {
        return;
      }
      if (image->height < 0x41) {
        return;
      }
      do {
        gimage::downscaleImage<unsigned_char>(&IStack_58,image,2);
        std::
        vector<gimage::Image<unsigned_char,gimage::PixelTraits<unsigned_char>>,std::allocator<gimage::Image<unsigned_char,gimage::PixelTraits<unsigned_char>>>>
        ::emplace_back<gimage::Image<unsigned_char,gimage::PixelTraits<unsigned_char>>>
                  ((vector<gimage::Image<unsigned_char,gimage::PixelTraits<unsigned_char>>,std::allocator<gimage::Image<unsigned_char,gimage::PixelTraits<unsigned_char>>>>
                    *)&this->mipmap,&IStack_58);
        gimage::Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::~Image(&IStack_58);
        pIVar1 = (this->mipmap).
                 super__Vector_base<gimage::Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>,_std::allocator<gimage::Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        if (pIVar1[-1].width < 0x41) {
          return;
        }
        image = pIVar1 + -1;
      } while (0x40 < pIVar1[-1].height);
      return;
    }
    if (tf) {
      return;
    }
  }
  pIVar1 = (this->mipmap).
           super__Vector_base<gimage::Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>,_std::allocator<gimage::Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pIVar2 = (this->mipmap).
           super__Vector_base<gimage::Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>,_std::allocator<gimage::Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  this_00 = pIVar1;
  if (pIVar2 != pIVar1) {
    do {
      gimage::Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::~Image(this_00);
      this_00 = this_00 + 1;
    } while (this_00 != pIVar2);
    (this->mipmap).
    super__Vector_base<gimage::Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>,_std::allocator<gimage::Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = pIVar1;
  }
  return;
}

Assistant:

void setSmoothing(bool tf)
    {
      if (tf && mipmap.size() == 0)
      {
        const gimage::Image<T> *p=image;
        long w=p->getWidth();
        long h=p->getHeight();

        while (w > 64 && h > 64)
        {
          mipmap.push_back(downscaleImage(*p, 2));

          p=&mipmap.back();
          w=p->getWidth();
          h=p->getHeight();
        }
      }
      else if (!tf)
      {
        mipmap.clear();
      }
    }